

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::parsing::Trivia,_2UL>::SmallVector
          (SmallVector<slang::parsing::Trivia,_2UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::parsing::Trivia>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::parsing::Trivia>).firstElement;
  (this->super_SmallVectorBase<slang::parsing::Trivia>).len = 0;
  (this->super_SmallVectorBase<slang::parsing::Trivia>).cap = 2;
  SmallVectorBase<slang::parsing::Trivia>::reserve
            (&this->super_SmallVectorBase<slang::parsing::Trivia>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }